

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void gameExit(void)

{
  nite::AsyncTask::update();
  nite::AsyncTask::end();
  running = false;
  nite::printEnd();
  return;
}

Assistant:

static void gameExit(){
	// static auto *ins = Game::getGameCoreInstance();
	// if(!ins->isRunning){
	// 	return;
	// }
	nite::AsyncTask::update();
	nite::AsyncTask::end();	
	// ins->end();	
	// ins->onEnd();	
	running = false;
	nite::printEnd();
}